

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

void print_import_segment_info(import_segment sec)

{
  undefined8 uVar1;
  import_pointer paVar2;
  uint uVar3;
  long lVar4;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  paVar2 = sec.import_segment_addr;
  if (sec.import_segment_count != 0) {
    lVar4 = 0;
    local_48 = 0;
    local_40 = 0;
    local_38 = 0;
    uVar3 = 0;
    do {
      switch((&(paVar2->im_desc).tag)[lVar4]) {
      case '\0':
        uVar1 = *(undefined8 *)((long)&paVar2->name + lVar4);
        printf("  - func[%d]: typeId=%u <%s> <- %s.%s\n",(ulong)uVar3,
               (ulong)*(uint *)((long)&(paVar2->im_desc).field_1 + lVar4),uVar1,
               *(undefined8 *)((long)&paVar2->model_name + lVar4),uVar1);
        uVar3 = uVar3 + 1;
        break;
      case '\x01':
        uVar1 = *(undefined8 *)((long)&paVar2->name + lVar4);
        printf("  - table[%d]: <%s> <- %s.%s\n",local_38,uVar1,
               *(undefined8 *)((long)&paVar2->model_name + lVar4),uVar1);
        local_38 = (ulong)((int)local_38 + 1);
        break;
      case '\x02':
        uVar1 = *(undefined8 *)((long)&paVar2->name + lVar4);
        printf("  - mem[%d]: <%s> <- %s.%s\n",local_40,uVar1,
               *(undefined8 *)((long)&paVar2->model_name + lVar4),uVar1);
        local_40 = (ulong)((int)local_40 + 1);
        break;
      case '\x03':
        uVar1 = *(undefined8 *)((long)&paVar2->name + lVar4);
        printf("  - global[%d]: <%s> <- %s.%s\n",local_48,uVar1,
               *(undefined8 *)((long)&paVar2->model_name + lVar4),uVar1);
        local_48 = (ulong)((int)local_48 + 1);
      }
      lVar4 = lVar4 + 0x30;
    } while ((sec._0_8_ & 0xffffffff) * 0x30 != lVar4);
  }
  return;
}

Assistant:

void print_import_segment_info(import_segment sec) {
    import_pointer import_segment_addr;
    for (int i = 0, funCount = 0, tableCount = 0, memCount = 0, globalCount = 0; i < sec.import_segment_count; ++i) {
        import_segment_addr = sec.import_segment_addr + i;
        switch (import_segment_addr->im_desc.tag) {
            case func_im_export_tag:
                printf("  - func[%d]: typeId=%u <%s> <- %s.%s\n", funCount++, import_segment_addr->im_desc.typeIndex,
                       import_segment_addr->name,
                       import_segment_addr->model_name, import_segment_addr->name);
                break;
            case table_im_export_tag:
                printf("  - table[%d]: <%s> <- %s.%s\n", tableCount++,
                       import_segment_addr->name,
                       import_segment_addr->model_name, import_segment_addr->name);
                break;
            case mem_im_export_tag:
                printf("  - mem[%d]: <%s> <- %s.%s\n", memCount++,
                       import_segment_addr->name,
                       import_segment_addr->model_name, import_segment_addr->name);
                break;
            case global_im_export_tag:
                printf("  - global[%d]: <%s> <- %s.%s\n", globalCount++,
                       import_segment_addr->name,
                       import_segment_addr->model_name, import_segment_addr->name);
                break;
        }
    }
}